

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::Attribute
          (ParsedScene *this,string *target,ParsedParameterVector *attrib,FileLoc loc)

{
  ParsedParameter *this_00;
  bool bVar1;
  iterator ppPVar2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  FileLoc *in_RSI;
  FileLoc *in_RDI;
  ParsedParameter *p;
  iterator __end1;
  iterator __begin1;
  ParsedParameterVector *__range1;
  ParsedParameterVector *currentAttributes;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_01;
  SceneRepresentation *in_stack_ffffffffffffffc0;
  iterator local_30;
  char (*in_stack_ffffffffffffffe0) [10];
  
  this_01 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             *)&stack0x00000008;
  if (*(int *)&in_RDI[0x59].filename._M_str == 2) {
    Error<char_const(&)[10]>(in_RSI,(char *)in_RDX,in_stack_ffffffffffffffe0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_01,(char *)in_RDX);
    if ((((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this_01,(char *)in_RDX), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_01,(char *)in_RDX), bVar1)) ||
       ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_01,(char *)in_RDX), bVar1 ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_01,(char *)in_RDX), bVar1)))) {
      local_30 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::begin(in_RDX);
      ppPVar2 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                ::end(this_01);
      for (; local_30 != ppPVar2; local_30 = local_30 + 1) {
        this_00 = *local_30;
        this_00->mayBeUnused = true;
        this_00->colorSpace = *(RGBColorSpace **)(*(long *)&in_RDI[0x72].line + 0x108);
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::push_back((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                     *)this_00,(ParsedParameter **)in_RDI);
      }
    }
    else {
      SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                (in_stack_ffffffffffffffc0,in_RDI,(char *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX);
    }
  }
  return;
}

Assistant:

void ParsedScene::Attribute(const std::string &target, ParsedParameterVector attrib,
                            FileLoc loc) {
    VERIFY_INITIALIZED("Attribute");

    ParsedParameterVector *currentAttributes = nullptr;
    if (target == "shape") {
        currentAttributes = &graphicsState->shapeAttributes;
    } else if (target == "light") {
        currentAttributes = &graphicsState->lightAttributes;
    } else if (target == "material") {
        currentAttributes = &graphicsState->materialAttributes;
    } else if (target == "medium") {
        currentAttributes = &graphicsState->mediumAttributes;
    } else if (target == "texture") {
        currentAttributes = &graphicsState->textureAttributes;
    } else {
        ErrorExitDeferred(
            &loc,
            "Unknown attribute target \"%s\". Must be \"shape\", \"light\", "
            "\"material\", \"medium\", or \"texture\".",
            target);
        return;
    }

    // Note that we hold on to the current color space and associate it
    // with the parameters...
    for (ParsedParameter *p : attrib) {
        p->mayBeUnused = true;
        p->colorSpace = graphicsState->colorSpace;
        currentAttributes->push_back(p);
    }
}